

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::DoWhileStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQFuncState *pSVar2;
  SQUnsignedInteger SVar3;
  SQUnsignedInteger SVar4;
  ulong uVar5;
  ulong uVar6;
  SQUnsignedInteger SVar7;
  SQInteger SVar8;
  longlong *plVar9;
  long lVar10;
  SQUnsignedInteger SVar11;
  long lVar12;
  SQScope __oldscope__;
  SQInstruction local_58;
  SQUnsignedInteger local_50;
  SQInteger local_48;
  SQInteger SStack_40;
  
  SVar8 = SQLexer::Lex(&this->_lex);
  this->_token = SVar8;
  pSVar2 = this->_fs;
  SVar3 = (pSVar2->_instructions)._size;
  SVar4 = (pSVar2->_unresolvedbreaks)._size;
  local_50 = (pSVar2->_unresolvedcontinues)._size;
  uVar5 = (pSVar2->_breaktargets)._allocated;
  uVar6 = (pSVar2->_breaktargets)._size;
  if (uVar5 <= uVar6) {
    SVar7 = uVar6 * 2;
    SVar11 = 4;
    if (SVar7 != 0) {
      SVar11 = SVar7;
    }
    plVar9 = (longlong *)sq_vm_realloc((pSVar2->_breaktargets)._vals,uVar5 << 3,SVar11 * 8);
    (pSVar2->_breaktargets)._vals = plVar9;
    (pSVar2->_breaktargets)._allocated = SVar11;
  }
  SVar7 = (pSVar2->_breaktargets)._size;
  (pSVar2->_breaktargets)._size = SVar7 + 1;
  (pSVar2->_breaktargets)._vals[SVar7] = 0;
  pSVar2 = this->_fs;
  uVar5 = (pSVar2->_continuetargets)._size;
  uVar6 = (pSVar2->_continuetargets)._allocated;
  if (uVar6 <= uVar5) {
    SVar7 = uVar5 * 2;
    SVar11 = 4;
    if (SVar7 != 0) {
      SVar11 = SVar7;
    }
    plVar9 = (longlong *)sq_vm_realloc((pSVar2->_continuetargets)._vals,uVar6 << 3,SVar11 * 8);
    (pSVar2->_continuetargets)._vals = plVar9;
    (pSVar2->_continuetargets)._allocated = SVar11;
  }
  SVar7 = (pSVar2->_continuetargets)._size;
  (pSVar2->_continuetargets)._size = SVar7 + 1;
  (pSVar2->_continuetargets)._vals[SVar7] = 0;
  local_48 = (this->_scope).outers;
  SStack_40 = (this->_scope).stacksize;
  pSVar2 = this->_fs;
  (this->_scope).outers = pSVar2->_outers;
  SVar8 = SQFuncState::GetStackSize(pSVar2);
  (this->_scope).stacksize = SVar8;
  Statement(this,true);
  lVar10 = this->_fs->_outers;
  SVar8 = SQFuncState::GetStackSize(this->_fs);
  lVar12 = (this->_scope).stacksize;
  if (SVar8 != lVar12) {
    SQFuncState::SetStackSize(this->_fs,lVar12);
    if (lVar10 != this->_fs->_outers) {
      local_58._arg1 = (SQInt32)(this->_scope).stacksize;
      local_58.op = '<';
      local_58._arg0 = '\0';
      local_58._arg2 = '\0';
      local_58._arg3 = '\0';
      SQFuncState::AddInstruction(this->_fs,&local_58);
    }
  }
  (this->_scope).outers = local_48;
  (this->_scope).stacksize = SStack_40;
  Expect(this,0x112);
  SVar7 = (this->_fs->_instructions)._size;
  Expect(this,0x28);
  CommaExpr(this);
  Expect(this,0x29);
  pSVar2 = this->_fs;
  SVar8 = SQFuncState::PopTarget(pSVar2);
  local_58._arg0 = (char)SVar8;
  local_58.op = 0x1e;
  local_58._arg1 = 1;
  local_58._6_2_ = 0;
  SQFuncState::AddInstruction(pSVar2,&local_58);
  local_58._arg1 = (int)SVar3 + ~(uint)(this->_fs->_instructions)._size;
  local_58.op = '\x1c';
  local_58._arg0 = '\0';
  local_58._arg2 = '\0';
  local_58._arg3 = '\0';
  SQFuncState::AddInstruction(this->_fs,&local_58);
  pSVar2 = this->_fs;
  lVar12 = (pSVar2->_unresolvedbreaks)._size - SVar4;
  lVar10 = (pSVar2->_unresolvedcontinues)._size - local_50;
  if (0 < lVar10) {
    ResolveContinues(this,pSVar2,lVar10,SVar7 - 1);
  }
  if (0 < lVar12) {
    ResolveBreaks(this,this->_fs,lVar12);
  }
  pSVar2 = this->_fs;
  pSVar1 = &(pSVar2->_breaktargets)._size;
  *pSVar1 = *pSVar1 - 1;
  pSVar1 = &(pSVar2->_continuetargets)._size;
  *pSVar1 = *pSVar1 - 1;
  return;
}

Assistant:

void DoWhileStatement()
    {
        Lex();
        SQInteger jmptrg = _fs->GetCurrentPos();
        BEGIN_BREAKBLE_BLOCK()
        BEGIN_SCOPE();
        Statement();
        END_SCOPE();
        Expect(TK_WHILE);
        SQInteger continuetrg = _fs->GetCurrentPos();
        Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));
        _fs->AddInstruction(_OP_JZ, _fs->PopTarget(), 1);
        _fs->AddInstruction(_OP_JMP, 0, jmptrg - _fs->GetCurrentPos() - 1);
        END_BREAKBLE_BLOCK(continuetrg);
    }